

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int buffer_read_bi16(buffer_t *buffer,int16_t *data)

{
  ulong uVar1;
  ulong uVar2;
  cursor_t cVar3;
  ushort uVar4;
  ushort uVar5;
  
  uVar2 = buffer->size;
  cVar3 = buffer->cursor;
  uVar1 = cVar3 + 2;
  if (uVar2 < uVar1) {
    uVar4 = 0;
    uVar5 = 0;
  }
  else {
    uVar4 = (ushort)buffer->data[cVar3 + 1];
    uVar5 = (ushort)buffer->data[cVar3] << 8;
  }
  if (uVar2 >= uVar1) {
    *data = uVar4 | uVar5;
  }
  return (uint)(uVar2 < uVar1);
}

Assistant:

int
buffer_read(buffer_t *buffer, void *data, size_t size)
{
    if (buffer->cursor + size > buffer->size) {
        return 1;
    }

    memcpy(data, &buffer->data[buffer->cursor], size);
    return 0;
}